

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heritage.cc
# Opt level: O1

void __thiscall Heritage::propagateCopyAway(Heritage *this,PcodeOp *op)

{
  bool bVar1;
  bool bVar2;
  Varnode *pVVar3;
  Varnode *newvn;
  bool bVar4;
  
  pVVar3 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    newvn = pVVar3;
    if ((pVVar3->flags & 0x10) == 0) break;
    if (pVVar3->def->opcode->opcode == CPUI_COPY) {
      newvn = *(pVVar3->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar1 = (pVVar3->loc).offset == (newvn->loc).offset;
      bVar2 = (newvn->loc).base == (pVVar3->loc).base;
      bVar4 = bVar1 && bVar2;
      if (!bVar1 || !bVar2) {
        newvn = pVVar3;
      }
    }
    else {
      bVar4 = false;
    }
    pVVar3 = newvn;
  } while (bVar4);
  Funcdata::totalReplace(this->fd,op->output,newvn);
  Funcdata::opDestroy(this->fd,op);
  return;
}

Assistant:

void Heritage::propagateCopyAway(PcodeOp *op)

{
  Varnode *inVn = op->getIn(0);
  while(inVn->isWritten()) {		// Follow any COPY chain to earliest input
    PcodeOp *nextOp = inVn->getDef();
    if (nextOp->code() != CPUI_COPY) break;
    Varnode *nextIn = nextOp->getIn(0);
    if (nextIn->getAddr() != inVn->getAddr()) break;
    inVn = nextIn;
  }
  fd->totalReplace(op->getOut(),inVn);
  fd->opDestroy(op);
}